

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O2

bool __thiscall SM83::ExecuteCBOpcode(SM83 *this,u8 opcode)

{
  undefined1 uVar1;
  undefined3 in_register_00000031;
  
  uVar1 = (*(code *)(&DAT_00125e60 +
                    *(int *)(&DAT_00125e60 + (ulong)CONCAT31(in_register_00000031,opcode) * 4)))();
  return (bool)uVar1;
}

Assistant:

bool SM83::ExecuteCBOpcode(const u8 opcode) {
    switch (opcode) {
        INSTR(0x00, LTRACE("RLC B"); rlc_r(&b));
        INSTR(0x01, LTRACE("RLC C"); rlc_r(&c));
        INSTR(0x02, LTRACE("RLC D"); rlc_r(&d));
        INSTR(0x03, LTRACE("RLC E"); rlc_r(&e));
        INSTR(0x04, LTRACE("RLC H"); rlc_r(&h));
        INSTR(0x05, LTRACE("RLC L"); rlc_r(&l));
        INSTR(0x06, rlc_dhl());
        INSTR(0x07, LTRACE("RLC A"); rlc_r(&a));
        INSTR(0x08, LTRACE("RRC B"); rrc_r(&b));
        INSTR(0x09, LTRACE("RRC C"); rrc_r(&c));
        INSTR(0x0A, LTRACE("RRC D"); rrc_r(&d));
        INSTR(0x0B, LTRACE("RRC E"); rrc_r(&e));
        INSTR(0x0C, LTRACE("RRC H"); rrc_r(&h));
        INSTR(0x0D, LTRACE("RRC L"); rrc_r(&l));
        INSTR(0x0E, rrc_dhl());
        INSTR(0x0F, LTRACE("RRC A"); rrc_r(&a));
        INSTR(0x10, LTRACE("RL B"); rl_r(&b));
        INSTR(0x11, LTRACE("RL C"); rl_r(&c));
        INSTR(0x12, LTRACE("RL D"); rl_r(&d));
        INSTR(0x13, LTRACE("RL E"); rl_r(&e));
        INSTR(0x14, LTRACE("RL H"); rl_r(&h));
        INSTR(0x15, LTRACE("RL L"); rl_r(&l));
        INSTR(0x16, rl_dhl());
        INSTR(0x17, LTRACE("RL A"); rl_r(&a));
        INSTR(0x18, LTRACE("RR B"); rr_r(&b));
        INSTR(0x19, LTRACE("RR C"); rr_r(&c));
        INSTR(0x1A, LTRACE("RR D"); rr_r(&d));
        INSTR(0x1B, LTRACE("RR E"); rr_r(&e));
        INSTR(0x1C, LTRACE("RR H"); rr_r(&h));
        INSTR(0x1D, LTRACE("RR L"); rr_r(&l));
        INSTR(0x1E, rr_dhl());
        INSTR(0x1F, LTRACE("RR A"); rr_r(&a));
        INSTR(0x20, LTRACE("SLA B"); sla_r(&b));
        INSTR(0x21, LTRACE("SLA C"); sla_r(&c));
        INSTR(0x22, LTRACE("SLA D"); sla_r(&d));
        INSTR(0x23, LTRACE("SLA E"); sla_r(&e));
        INSTR(0x24, LTRACE("SLA H"); sla_r(&h));
        INSTR(0x25, LTRACE("SLA L"); sla_r(&l));
        INSTR(0x26, sla_dhl());
        INSTR(0x27, LTRACE("SLA A"); sla_r(&a));
        INSTR(0x28, LTRACE("SRA B"); sra_r(&b));
        INSTR(0x29, LTRACE("SRA C"); sra_r(&c));
        INSTR(0x2A, LTRACE("SRA D"); sra_r(&d));
        INSTR(0x2B, LTRACE("SRA E"); sra_r(&e));
        INSTR(0x2C, LTRACE("SRA H"); sra_r(&h));
        INSTR(0x2D, LTRACE("SRA L"); sra_r(&l));
        INSTR(0x2E, sra_dhl());
        INSTR(0x2F, LTRACE("SRA A"); sra_r(&a));
        INSTR(0x30, LTRACE("SWAP B"); swap_r(&b));
        INSTR(0x31, LTRACE("SWAP C"); swap_r(&c));
        INSTR(0x32, LTRACE("SWAP D"); swap_r(&d));
        INSTR(0x33, LTRACE("SWAP E"); swap_r(&e));
        INSTR(0x34, LTRACE("SWAP H"); swap_r(&h));
        INSTR(0x35, LTRACE("SWAP L"); swap_r(&l));
        INSTR(0x36, swap_dhl());
        INSTR(0x37, LTRACE("SWAP A"); swap_r(&a));
        INSTR(0x38, LTRACE("SRL B"); srl_r(&b));
        INSTR(0x39, LTRACE("SRL C"); srl_r(&c));
        INSTR(0x3A, LTRACE("SRL D"); srl_r(&d));
        INSTR(0x3B, LTRACE("SRL E"); srl_r(&e));
        INSTR(0x3C, LTRACE("SRL H"); srl_r(&h));
        INSTR(0x3D, LTRACE("SRL L"); srl_r(&l));
        INSTR(0x3E, srl_dhl());
        INSTR(0x3F, LTRACE("SRL A"); srl_r(&a));
        INSTR(0x40, (bit<0, Registers::B>()));
        INSTR(0x41, (bit<0, Registers::C>()));
        INSTR(0x42, (bit<0, Registers::D>()));
        INSTR(0x43, (bit<0, Registers::E>()));
        INSTR(0x44, (bit<0, Registers::H>()));
        INSTR(0x45, (bit<0, Registers::L>()));
        INSTR(0x46, bit_dhl<0>());
        INSTR(0x47, (bit<0, Registers::A>()));
        INSTR(0x48, (bit<1, Registers::B>()));
        INSTR(0x49, (bit<1, Registers::C>()));
        INSTR(0x4A, (bit<1, Registers::D>()));
        INSTR(0x4B, (bit<1, Registers::E>()));
        INSTR(0x4C, (bit<1, Registers::H>()));
        INSTR(0x4D, (bit<1, Registers::L>()));
        INSTR(0x4E, bit_dhl<1>());
        INSTR(0x4F, (bit<1, Registers::A>()));
        INSTR(0x50, (bit<2, Registers::B>()));
        INSTR(0x51, (bit<2, Registers::C>()));
        INSTR(0x52, (bit<2, Registers::D>()));
        INSTR(0x53, (bit<2, Registers::E>()));
        INSTR(0x54, (bit<2, Registers::H>()));
        INSTR(0x55, (bit<2, Registers::L>()));
        INSTR(0x56, bit_dhl<2>());
        INSTR(0x57, (bit<2, Registers::A>()));
        INSTR(0x58, (bit<3, Registers::B>()));
        INSTR(0x59, (bit<3, Registers::C>()));
        INSTR(0x5A, (bit<3, Registers::D>()));
        INSTR(0x5B, (bit<3, Registers::E>()));
        INSTR(0x5C, (bit<3, Registers::H>()));
        INSTR(0x5D, (bit<3, Registers::L>()));
        INSTR(0x5E, bit_dhl<3>());
        INSTR(0x5F, (bit<3, Registers::A>()));
        INSTR(0x60, (bit<4, Registers::B>()));
        INSTR(0x61, (bit<4, Registers::C>()));
        INSTR(0x62, (bit<4, Registers::D>()));
        INSTR(0x63, (bit<4, Registers::E>()));
        INSTR(0x64, (bit<4, Registers::H>()));
        INSTR(0x65, (bit<4, Registers::L>()));
        INSTR(0x66, bit_dhl<4>());
        INSTR(0x67, (bit<4, Registers::A>()));
        INSTR(0x68, (bit<5, Registers::B>()));
        INSTR(0x69, (bit<5, Registers::C>()));
        INSTR(0x6A, (bit<5, Registers::D>()));
        INSTR(0x6B, (bit<5, Registers::E>()));
        INSTR(0x6C, (bit<5, Registers::H>()));
        INSTR(0x6D, (bit<5, Registers::L>()));
        INSTR(0x6E, bit_dhl<5>());
        INSTR(0x6F, (bit<5, Registers::A>()));
        INSTR(0x70, (bit<6, Registers::B>()));
        INSTR(0x71, (bit<6, Registers::C>()));
        INSTR(0x72, (bit<6, Registers::D>()));
        INSTR(0x73, (bit<6, Registers::E>()));
        INSTR(0x74, (bit<6, Registers::H>()));
        INSTR(0x75, (bit<6, Registers::L>()));
        INSTR(0x76, bit_dhl<6>());
        INSTR(0x77, (bit<6, Registers::A>()));
        INSTR(0x78, (bit<7, Registers::B>()));
        INSTR(0x79, (bit<7, Registers::C>()));
        INSTR(0x7A, (bit<7, Registers::D>()));
        INSTR(0x7B, (bit<7, Registers::E>()));
        INSTR(0x7C, (bit<7, Registers::H>()));
        INSTR(0x7D, (bit<7, Registers::L>()));
        INSTR(0x7E, bit_dhl<7>());
        INSTR(0x7F, (bit<7, Registers::A>()));
        INSTR(0x80, (res<0, Registers::B>()));
        INSTR(0x81, (res<0, Registers::C>()));
        INSTR(0x82, (res<0, Registers::D>()));
        INSTR(0x83, (res<0, Registers::E>()));
        INSTR(0x84, (res<0, Registers::H>()));
        INSTR(0x85, (res<0, Registers::L>()));
        INSTR(0x86, res_dhl(0));
        INSTR(0x87, (res<0, Registers::A>()));
        INSTR(0x88, (res<1, Registers::B>()));
        INSTR(0x89, (res<1, Registers::C>()));
        INSTR(0x8A, (res<1, Registers::D>()));
        INSTR(0x8B, (res<1, Registers::E>()));
        INSTR(0x8C, (res<1, Registers::H>()));
        INSTR(0x8D, (res<1, Registers::L>()));
        INSTR(0x8E, res_dhl(1));
        INSTR(0x8F, (res<1, Registers::A>()));
        INSTR(0x90, (res<2, Registers::B>()));
        INSTR(0x91, (res<2, Registers::C>()));
        INSTR(0x92, (res<2, Registers::D>()));
        INSTR(0x93, (res<2, Registers::E>()));
        INSTR(0x94, (res<2, Registers::H>()));
        INSTR(0x95, (res<2, Registers::L>()));
        INSTR(0x96, res_dhl(2));
        INSTR(0x97, (res<2, Registers::A>()));
        INSTR(0x98, (res<3, Registers::B>()));
        INSTR(0x99, (res<3, Registers::C>()));
        INSTR(0x9A, (res<3, Registers::D>()));
        INSTR(0x9B, (res<3, Registers::E>()));
        INSTR(0x9C, (res<3, Registers::H>()));
        INSTR(0x9D, (res<3, Registers::L>()));
        INSTR(0x9E, res_dhl(3));
        INSTR(0x9F, (res<3, Registers::A>()));
        INSTR(0xA0, (res<4, Registers::B>()));
        INSTR(0xA1, (res<4, Registers::C>()));
        INSTR(0xA2, (res<4, Registers::D>()));
        INSTR(0xA3, (res<4, Registers::E>()));
        INSTR(0xA4, (res<4, Registers::H>()));
        INSTR(0xA5, (res<4, Registers::L>()));
        INSTR(0xA6, res_dhl(4));
        INSTR(0xA7, (res<4, Registers::A>()));
        INSTR(0xA8, (res<5, Registers::B>()));
        INSTR(0xA9, (res<5, Registers::C>()));
        INSTR(0xAA, (res<5, Registers::D>()));
        INSTR(0xAB, (res<5, Registers::E>()));
        INSTR(0xAC, (res<5, Registers::H>()));
        INSTR(0xAD, (res<5, Registers::L>()));
        INSTR(0xAE, res_dhl(5));
        INSTR(0xAF, (res<5, Registers::A>()));
        INSTR(0xB0, (res<6, Registers::B>()));
        INSTR(0xB1, (res<6, Registers::C>()));
        INSTR(0xB2, (res<6, Registers::D>()));
        INSTR(0xB3, (res<6, Registers::E>()));
        INSTR(0xB4, (res<6, Registers::H>()));
        INSTR(0xB5, (res<6, Registers::L>()));
        INSTR(0xB6, res_dhl(6));
        INSTR(0xB7, (res<6, Registers::A>()));
        INSTR(0xB8, (res<7, Registers::B>()));
        INSTR(0xB9, (res<7, Registers::C>()));
        INSTR(0xBA, (res<7, Registers::D>()));
        INSTR(0xBB, (res<7, Registers::E>()));
        INSTR(0xBC, (res<7, Registers::H>()));
        INSTR(0xBD, (res<7, Registers::L>()));
        INSTR(0xBE, res_dhl(7));
        INSTR(0xBF, (res<7, Registers::A>()));
        INSTR(0xC0, (set<0, Registers::B>()));
        INSTR(0xC1, (set<0, Registers::C>()));
        INSTR(0xC2, (set<0, Registers::D>()));
        INSTR(0xC3, (set<0, Registers::E>()));
        INSTR(0xC4, (set<0, Registers::H>()));
        INSTR(0xC5, (set<0, Registers::L>()));
        INSTR(0xC6, set_dhl<0>());
        INSTR(0xC7, (set<0, Registers::A>()));
        INSTR(0xC8, (set<1, Registers::B>()));
        INSTR(0xC9, (set<1, Registers::C>()));
        INSTR(0xCA, (set<1, Registers::D>()));
        INSTR(0xCB, (set<1, Registers::E>()));
        INSTR(0xCC, (set<1, Registers::H>()));
        INSTR(0xCD, (set<1, Registers::L>()));
        INSTR(0xCE, set_dhl<1>());
        INSTR(0xCF, (set<1, Registers::A>()));
        INSTR(0xD0, (set<2, Registers::B>()));
        INSTR(0xD1, (set<2, Registers::C>()));
        INSTR(0xD2, (set<2, Registers::D>()));
        INSTR(0xD3, (set<2, Registers::E>()));
        INSTR(0xD4, (set<2, Registers::H>()));
        INSTR(0xD5, (set<2, Registers::L>()));
        INSTR(0xD6, set_dhl<2>());
        INSTR(0xD7, (set<2, Registers::A>()));
        INSTR(0xD8, (set<3, Registers::B>()));
        INSTR(0xD9, (set<3, Registers::C>()));
        INSTR(0xDA, (set<3, Registers::D>()));
        INSTR(0xDB, (set<3, Registers::E>()));
        INSTR(0xDC, (set<3, Registers::H>()));
        INSTR(0xDD, (set<3, Registers::L>()));
        INSTR(0xDE, set_dhl<3>());
        INSTR(0xDF, (set<3, Registers::A>()));
        INSTR(0xE0, (set<4, Registers::B>()));
        INSTR(0xE1, (set<4, Registers::C>()));
        INSTR(0xE2, (set<4, Registers::D>()));
        INSTR(0xE3, (set<4, Registers::E>()));
        INSTR(0xE4, (set<4, Registers::H>()));
        INSTR(0xE5, (set<4, Registers::L>()));
        INSTR(0xE6, set_dhl<4>());
        INSTR(0xE7, (set<4, Registers::A>()));
        INSTR(0xE8, (set<5, Registers::B>()));
        INSTR(0xE9, (set<5, Registers::C>()));
        INSTR(0xEA, (set<5, Registers::D>()));
        INSTR(0xEB, (set<5, Registers::E>()));
        INSTR(0xEC, (set<5, Registers::H>()));
        INSTR(0xED, (set<5, Registers::L>()));
        INSTR(0xEE, set_dhl<5>());
        INSTR(0xEF, (set<5, Registers::A>()));
        INSTR(0xF0, (set<6, Registers::B>()));
        INSTR(0xF1, (set<6, Registers::C>()));
        INSTR(0xF2, (set<6, Registers::D>()));
        INSTR(0xF3, (set<6, Registers::E>()));
        INSTR(0xF4, (set<6, Registers::H>()));
        INSTR(0xF5, (set<6, Registers::L>()));
        INSTR(0xF6, set_dhl<6>());
        INSTR(0xF7, (set<6, Registers::A>()));
        INSTR(0xF8, (set<7, Registers::B>()));
        INSTR(0xF9, (set<7, Registers::C>()));
        INSTR(0xFA, (set<7, Registers::D>()));
        INSTR(0xFB, (set<7, Registers::E>()));
        INSTR(0xFC, (set<7, Registers::H>()));
        INSTR(0xFD, (set<7, Registers::L>()));
        INSTR(0xFE, set_dhl<7>());
        INSTR(0xFF, (set<7, Registers::A>()));
#undef INSTR
        default:
            UNREACHABLE();
    }

    return true;
}